

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnExport
          (SharedValidator *this,Location *loc,ExternalKind kind,Var *item_var,string_view name)

{
  Result RVar1;
  iterator iVar2;
  Enum EVar3;
  char *pcVar4;
  Var *this_00;
  string name_str;
  key_type local_1c8;
  Location *local_1a8;
  Index local_19c;
  Var local_198;
  Var local_150;
  Var local_108;
  Var local_c0;
  Var local_78;
  
  pcVar4 = name._M_str;
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  local_1a8 = loc;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,pcVar4,pcVar4 + name._M_len);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->export_names_)._M_t,&local_1c8);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->export_names_)._M_t._M_impl.super__Rb_tree_header)
  {
    EVar3 = Ok;
  }
  else {
    RVar1 = PrintError(this,local_1a8,"duplicate export \"%.*s\"",name._M_len & 0xffffffff,pcVar4);
    EVar3 = (Enum)(RVar1.enum_ == Error);
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->export_names_,&local_1c8);
  switch(kind) {
  case First:
    Var::Var(&local_78,item_var);
    RVar1 = CheckFuncIndex(this,&local_78,(FuncType *)0x0);
    Var::~Var(&local_78);
    if (item_var->type_ != Index) {
      __assert_fail("is_index()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/ir.h"
                    ,0x3a,"Index wabt::Var::index() const");
    }
    EVar3 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar3);
    local_19c = (item_var->field_2).index_;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&(this->declared_funcs_)._M_t,&local_19c);
    goto switchD_0014969a_default;
  case Table:
    this_00 = &local_c0;
    Var::Var(this_00,item_var);
    RVar1 = CheckTableIndex(this,this_00,(TableType *)0x0);
    break;
  case Memory:
    this_00 = &local_108;
    Var::Var(this_00,item_var);
    RVar1 = CheckMemoryIndex(this,this_00,(MemoryType *)0x0);
    break;
  case Global:
    this_00 = &local_150;
    Var::Var(this_00,item_var);
    RVar1 = CheckGlobalIndex(this,this_00,(GlobalType *)0x0);
    break;
  case Last:
    this_00 = &local_198;
    Var::Var(this_00,item_var);
    RVar1 = CheckTagIndex(this,this_00,(TagType *)0x0);
    break;
  default:
    goto switchD_0014969a_default;
  }
  EVar3 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar3);
  Var::~Var(this_00);
switchD_0014969a_default:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  return (Result)EVar3;
}

Assistant:

Result SharedValidator::OnExport(const Location& loc,
                                 ExternalKind kind,
                                 Var item_var,
                                 std::string_view name) {
  Result result = Result::Ok;
  auto name_str = std::string(name);
  if (export_names_.find(name_str) != export_names_.end()) {
    result |= PrintError(loc, "duplicate export \"" PRIstringview "\"",
                         WABT_PRINTF_STRING_VIEW_ARG(name));
  }
  export_names_.insert(name_str);

  switch (kind) {
    case ExternalKind::Func:
      result |= CheckFuncIndex(item_var);
      declared_funcs_.insert(item_var.index());
      break;

    case ExternalKind::Table:
      result |= CheckTableIndex(item_var);
      break;

    case ExternalKind::Memory:
      result |= CheckMemoryIndex(item_var);
      break;

    case ExternalKind::Global:
      result |= CheckGlobalIndex(item_var);
      break;

    case ExternalKind::Tag:
      result |= CheckTagIndex(item_var);
      break;
  }
  return result;
}